

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TilePool.cpp
# Opt level: O2

void __thiscall TilePool::debugPrintInfo(TilePool *this)

{
  pointer puVar1;
  unsigned_long *in_RCX;
  unsigned_long_long *in_R9;
  format_string_t<unsigned_long> fmt;
  format_string_t<unsigned_long_&,_unsigned_int_&,_unsigned_long_long> fmt_00;
  ulong local_38;
  undefined8 local_30;
  
  local_38 = (long)(this->items_).
                   super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->items_).
                   super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3;
  fmt.str.size_ = (size_t)&local_38;
  fmt.str.data_ = (char *)0x20;
  spdlog::debug<unsigned_long>((spdlog *)"TilePool info: pool has {} items",fmt,in_RCX);
  local_38 = 0;
  while( true ) {
    puVar1 = (this->items_).
             super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->items_).
                      super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= local_38)
    break;
    local_30 = *(undefined8 *)
                ((long)puVar1[local_38]._M_t.
                       super___uniq_ptr_impl<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>
                + 0x1030);
    fmt_00.str.size_ = (size_t)&local_38;
    fmt_00.str.data_ = (char *)0x21;
    spdlog::debug<unsigned_long&,unsigned_int&,unsigned_long_long>
              ((spdlog *)"  item {}: {} allocated, {:#018x}",fmt_00,
               (unsigned_long *)
               ((this->itemsAllocatedCount_).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start + local_38),(uint *)&local_30,in_R9);
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

void TilePool::debugPrintInfo() {
    /*spdlog::debug("TilePool info: pool has {} items, baseId = {}, upperId = {}", items_.size(), baseId_, upperId_);
    for (size_t i = 0; i < items_.size(); ++i) {
        if (items_[i] == nullptr) {
            spdlog::debug("  item {}: null", i);
        } else {
            spdlog::debug("  item {}: {} allocated", i, items_[i]->allocatedCount);
        }
    }*/

    spdlog::debug("TilePool info: pool has {} items", items_.size());
    for (size_t i = 0; i < items_.size(); ++i) {
        spdlog::debug("  item {}: {} allocated, {:#018x}", i, itemsAllocatedCount_[i], items_[i]->allocated.to_ullong());
    }
}